

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O2

size_t sx_os_processmem(void)

{
  int iVar1;
  FILE *__stream;
  long pages;
  
  __stream = fopen("/proc/self/statm","r");
  if (__stream != (FILE *)0x0) {
    iVar1 = __isoc99_fscanf(__stream,"%*s%ld");
    fclose(__stream);
    if (iVar1 == 1) {
      sysconf(0x1e);
    }
  }
  return 0;
}

Assistant:

size_t sx_os_processmem(void)
{
#if SX_PLATFORM_ANDROID
    struct mallinfo mi = mallinfo();
    return mi.uordblks;
#elif SX_PLATFORM_LINUX || SX_PLATFORM_HURD
    FILE* file = fopen("/proc/self/statm", "r");
    if (NULL == file) {
        return 0;
    }

    long pages = 0;
    int items = fscanf(file, "%*s%ld", &pages);
    fclose(file);
    return 1 == items ? pages * sysconf(_SC_PAGESIZE) : 0;
#elif SX_PLATFORM_OSX
#    if defined(MACH_TASK_BASIC_INFO)
    struct mach_task_basic_info info;
    mach_msg_type_number_t infoCount = MACH_TASK_BASIC_INFO_COUNT;

    int const result =
        task_info(mach_task_self(), MACH_TASK_BASIC_INFO, (task_info_t)&info, &infoCount);
#    else
    task_basic_info info;
    mach_msg_type_number_t infoCount = TASK_BASIC_INFO_COUNT;

    int const result = task_info(mach_task_self(), TASK_BASIC_INFO, (task_info_t)&info, &infoCount);
#    endif    // defined(MACH_TASK_BASIC_INFO)
    if (KERN_SUCCESS != result) {
        return 0;
    }

    return info.resident_size;
#elif SX_PLATFORM_WINDOWS
    PROCESS_MEMORY_COUNTERS pmc;
    GetProcessMemoryInfo(GetCurrentProcess(), &pmc, sizeof(pmc));
    return pmc.WorkingSetSize;
#else
    return 0;
#endif    // SX_PLATFORM_*
}